

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledRgbaFile.cpp
# Opt level: O2

void __thiscall
Imf_2_5::TiledRgbaInputFile::FromYa::readTile(FromYa *this,int dx,int dy,int lx,int ly)

{
  long lVar1;
  Rgba *pRVar2;
  long lVar3;
  ostream *poVar4;
  char *pcVar5;
  ArgExc *this_00;
  int x1;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  Box2i dw;
  ostream local_1a8 [376];
  
  if (this->_fbBase != (Rgba *)0x0) {
    TiledInputFile::readTile(this->_inputFile,dx,dy,lx,ly);
    TiledInputFile::dataWindowForTile((TiledInputFile *)&dw,(int)this->_inputFile,dx,dy,lx);
    lVar11 = (long)dw.max.x;
    lVar3 = (long)dw.min.x;
    lVar8 = 0;
    lVar10 = 0;
    for (lVar7 = (long)dw.min.y; lVar7 <= dw.max.y; lVar7 = lVar7 + 1) {
      lVar9 = 0;
      lVar6 = 0;
      while( true ) {
        lVar1 = (this->_buf)._sizeY;
        pRVar2 = (this->_buf)._data;
        if (lVar11 - lVar3 < lVar6) break;
        half::operator=((half *)((long)&(pRVar2->r)._h + lVar1 * lVar8 + lVar9),0.0);
        half::operator=((half *)((long)&(((this->_buf)._data)->b)._h +
                                lVar9 + (this->_buf)._sizeY * lVar8),0.0);
        lVar6 = lVar6 + 1;
        lVar9 = lVar9 + 8;
      }
      pRVar2 = pRVar2 + lVar1 * lVar10;
      RgbaYca::YCAtoRGBA(&this->_yw,(int)(lVar11 - lVar3) + 1,pRVar2,pRVar2);
      for (lVar6 = 0; dw.min.x + lVar6 <= (long)dw.max.x; lVar6 = lVar6 + 1) {
        this->_fbBase[(dw.min.x + lVar6) * this->_fbXStride + this->_fbYStride * lVar7] =
             *(Rgba *)((long)&(this->_buf)._data[lVar6].r._h + (this->_buf)._sizeY * lVar8);
      }
      lVar10 = lVar10 + 1;
      lVar8 = lVar8 + 8;
    }
    return;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)&dw);
  poVar4 = std::operator<<(local_1a8,
                           "No frame buffer was specified as the pixel data destination for image file \""
                          );
  pcVar5 = TiledInputFile::fileName(this->_inputFile);
  poVar4 = std::operator<<(poVar4,pcVar5);
  std::operator<<(poVar4,"\".");
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::ArgExc::ArgExc(this_00,(stringstream *)&dw);
  __cxa_throw(this_00,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
}

Assistant:

void
TiledRgbaInputFile::FromYa::readTile (int dx, int dy, int lx, int ly)
{
    if (_fbBase == 0)
    {
	THROW (IEX_NAMESPACE::ArgExc, "No frame buffer was specified as the "
			    "pixel data destination for image file "
			    "\"" << _inputFile.fileName() << "\".");
    }

    //
    // Read the tile requested by the caller into _buf.
    //
    
    _inputFile.readTile (dx, dy, lx, ly);

    //
    // Convert the luminance/alpha pixels to RGBA
    // and copy them into the caller's frame buffer.
    //

    Box2i dw = _inputFile.dataWindowForTile (dx, dy, lx, ly);
    int width = dw.max.x - dw.min.x + 1;

    for (int y = dw.min.y, y1 = 0; y <= dw.max.y; ++y, ++y1)
    {
	for (int x1 = 0; x1 < width; ++x1)
	{
	    _buf[y1][x1].r = 0;
	    _buf[y1][x1].b = 0;
	}

	YCAtoRGBA (_yw, width, _buf[y1], _buf[y1]);

	for (int x = dw.min.x, x1 = 0; x <= dw.max.x; ++x, ++x1)
	{
	    _fbBase[x * _fbXStride + y * _fbYStride] = _buf[y1][x1];
	}
    }
}